

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

OperatorResultType
duckdb::RangeDateTimeFunction<false>
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  int iVar1;
  int iVar2;
  LocalTableFunctionState *pLVar3;
  _func_int **pp_Var4;
  unsigned_long *puVar5;
  _func_int **pp_Var6;
  data_ptr_t pdVar7;
  OperatorResultType OVar8;
  reference pvVar9;
  timestamp_t tVar10;
  BinderException *pBVar11;
  byte bVar12;
  DataChunk *pDVar13;
  undefined7 uVar14;
  size_type __n;
  idx_t entry_idx;
  ulong uVar15;
  bool bVar16;
  interval_t right;
  string local_60;
  LocalTableFunctionState *local_40;
  DataChunk *local_38;
  
  pDVar13 = output;
  optional_ptr<duckdb::LocalTableFunctionState,_true>::CheckValid(&data_p->local_state);
  pLVar3 = (data_p->local_state).ptr;
  local_40 = pLVar3 + 4;
  local_38 = output;
  do {
    if (*(char *)&pLVar3[1]._vptr_LocalTableFunctionState == '\0') {
      pp_Var4 = pLVar3[2]._vptr_LocalTableFunctionState;
      if ((_func_int **)input->count <= pp_Var4) {
        pLVar3[2]._vptr_LocalTableFunctionState = (_func_int **)0x0;
        OVar8 = NEED_MORE_INPUT;
        goto LAB_00a6b492;
      }
      DataChunk::Flatten(input);
      if ((input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pDVar13 = (DataChunk *)((ulong)pp_Var4 & 0xffffffff);
        bVar12 = (byte)pDVar13;
        bVar16 = true;
        __n = 0;
        do {
          pvVar9 = vector<duckdb::Vector,_true>::operator[](&input->data,__n);
          puVar5 = (pvVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 != (unsigned_long *)0x0) &&
             ((puVar5[(ulong)pp_Var4 >> 6] & 1L << (bVar12 & 0x3f)) == 0)) {
            local_40[2]._vptr_LocalTableFunctionState = (_func_int **)0x0;
            local_40[3]._vptr_LocalTableFunctionState = (_func_int **)0x0;
            local_40->_vptr_LocalTableFunctionState = (_func_int **)0x0;
            local_40[1]._vptr_LocalTableFunctionState = (_func_int **)0x0;
            *(undefined2 *)&pLVar3[8]._vptr_LocalTableFunctionState = 0x100;
            if (bVar16) goto LAB_00a6b395;
            break;
          }
          __n = __n + 1;
          pDVar13 = (DataChunk *)0x4ec4ec4ec4ec4ec5;
          bVar16 = __n < (ulong)(((long)(input->data).
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(input->data).
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                0x4ec4ec4ec4ec4ec5);
        } while (bVar16);
      }
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
      pLVar3[4]._vptr_LocalTableFunctionState = *(_func_int ***)(pvVar9->data + (long)pp_Var4 * 8);
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
      pLVar3[5]._vptr_LocalTableFunctionState = *(_func_int ***)(pvVar9->data + (long)pp_Var4 * 8);
      pvVar9 = vector<duckdb::Vector,_true>::operator[](&input->data,2);
      pDVar13 = *(DataChunk **)(pvVar9->data + (long)pp_Var4 * 0x10 + 8);
      pLVar3[6]._vptr_LocalTableFunctionState =
           *(_func_int ***)(pvVar9->data + (long)pp_Var4 * 0x10);
      pLVar3[7]._vptr_LocalTableFunctionState = (_func_int **)pDVar13;
      pp_Var4 = pLVar3[4]._vptr_LocalTableFunctionState;
      if ((((pp_Var4 == (_func_int **)0x8000000000000001) ||
           (pp_Var4 == (_func_int **)0x7fffffffffffffff)) ||
          (pp_Var6 = pLVar3[5]._vptr_LocalTableFunctionState,
          pp_Var6 == (_func_int **)0x7fffffffffffffff)) ||
         (pp_Var6 == (_func_int **)0x8000000000000001)) {
        pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"RANGE with infinite bounds is not supported","");
        BinderException::BinderException(pBVar11,&local_60);
        __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar1 = *(int *)&pLVar3[6]._vptr_LocalTableFunctionState;
      iVar2 = *(int *)((long)&pLVar3[6]._vptr_LocalTableFunctionState + 4);
      if (((iVar1 == 0) && (iVar2 == 0)) && (pDVar13 == (DataChunk *)0x0)) {
        pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"interval cannot be 0!","");
        BinderException::BinderException(pBVar11,&local_60);
        __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (((iVar1 < 1) && (iVar2 < 1)) && ((long)pDVar13 < 1)) {
        *(undefined1 *)((long)&pLVar3[8]._vptr_LocalTableFunctionState + 1) = 0;
        if ((long)pp_Var4 < (long)pp_Var6) {
LAB_00a6b38b:
          *(undefined1 *)((long)&pLVar3[8]._vptr_LocalTableFunctionState + 2) = 1;
        }
      }
      else {
        if (((iVar1 < 0) || (iVar2 < 0)) || ((long)pDVar13 < 0)) {
          pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_60,
                     "RANGE with composite interval that has mixed signs is not supported","");
          BinderException::BinderException(pBVar11,&local_60);
          __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        *(undefined1 *)((long)&pLVar3[8]._vptr_LocalTableFunctionState + 1) = 1;
        if ((long)pp_Var6 < (long)pp_Var4) goto LAB_00a6b38b;
      }
      *(undefined1 *)&pLVar3[8]._vptr_LocalTableFunctionState = 0;
LAB_00a6b395:
      *(undefined1 *)&pLVar3[1]._vptr_LocalTableFunctionState = 1;
      pLVar3[3]._vptr_LocalTableFunctionState = pLVar3[4]._vptr_LocalTableFunctionState;
      output = local_38;
    }
    if (*(char *)((long)&pLVar3[8]._vptr_LocalTableFunctionState + 2) == '\x01') {
      output->count = 0;
      pLVar3[2]._vptr_LocalTableFunctionState =
           (_func_int **)((long)pLVar3[2]._vptr_LocalTableFunctionState + 1);
      OVar8 = HAVE_MORE_OUTPUT;
LAB_00a6b492:
      *(undefined1 *)&pLVar3[1]._vptr_LocalTableFunctionState = 0;
      return OVar8;
    }
    pvVar9 = vector<duckdb::Vector,_true>::operator[](&output->data,0);
    pdVar7 = pvVar9->data;
    uVar15 = 0;
    while( true ) {
      pp_Var4 = pLVar3[3]._vptr_LocalTableFunctionState;
      uVar14 = (undefined7)((ulong)pDVar13 >> 8);
      if (*(char *)((long)&pLVar3[8]._vptr_LocalTableFunctionState + 1) == '\x01') {
        if (*(char *)&pLVar3[8]._vptr_LocalTableFunctionState == '\x01') {
          pDVar13 = (DataChunk *)
                    CONCAT71(uVar14,(long)pLVar3[5]._vptr_LocalTableFunctionState < (long)pp_Var4);
        }
        else {
          pDVar13 = (DataChunk *)
                    CONCAT71(uVar14,(long)pLVar3[5]._vptr_LocalTableFunctionState <= (long)pp_Var4);
        }
      }
      else if (*(char *)&pLVar3[8]._vptr_LocalTableFunctionState == '\x01') {
        pDVar13 = (DataChunk *)
                  CONCAT71(uVar14,(long)pp_Var4 < (long)pLVar3[5]._vptr_LocalTableFunctionState);
      }
      else {
        pDVar13 = (DataChunk *)
                  CONCAT71(uVar14,(long)pp_Var4 <= (long)pLVar3[5]._vptr_LocalTableFunctionState);
      }
      if (((char)pDVar13 != '\0') || (0x7ff < uVar15)) break;
      *(_func_int ***)(pdVar7 + uVar15 * 8) = pp_Var4;
      uVar15 = uVar15 + 1;
      right.micros = (int64_t)pDVar13;
      right._0_8_ = pLVar3[7]._vptr_LocalTableFunctionState;
      tVar10 = AddOperator::Operation<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
                         ((AddOperator *)pLVar3[3]._vptr_LocalTableFunctionState,
                          (timestamp_t)pLVar3[6]._vptr_LocalTableFunctionState,right);
      pLVar3[3]._vptr_LocalTableFunctionState = (_func_int **)tVar10.value;
    }
    if (uVar15 != 0) {
      output->count = uVar15;
      return HAVE_MORE_OUTPUT;
    }
    pLVar3[2]._vptr_LocalTableFunctionState =
         (_func_int **)((long)pLVar3[2]._vptr_LocalTableFunctionState + 1);
    *(undefined1 *)&pLVar3[1]._vptr_LocalTableFunctionState = 0;
  } while( true );
}

Assistant:

static OperatorResultType RangeDateTimeFunction(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
                                                DataChunk &output) {
	auto &state = data_p.local_state->Cast<RangeDateTimeLocalState>();
	while (true) {
		if (!state.initialized_row) {
			// initialize for the current input row
			if (state.current_input_row >= input.size()) {
				// ran out of rows
				state.current_input_row = 0;
				state.initialized_row = false;
				return OperatorResultType::NEED_MORE_INPUT;
			}
			GenerateRangeDateTimeParameters<GENERATE_SERIES>(input, state.current_input_row, state);
			state.initialized_row = true;
			state.current_state = state.start;
		}
		if (state.empty_range) {
			// empty range
			output.SetCardinality(0);
			state.current_input_row++;
			state.initialized_row = false;
			return OperatorResultType::HAVE_MORE_OUTPUT;
		}
		idx_t size = 0;
		auto data = FlatVector::GetData<timestamp_t>(output.data[0]);
		while (true) {
			if (state.Finished(state.current_state)) {
				break;
			}
			if (size >= STANDARD_VECTOR_SIZE) {
				break;
			}
			data[size++] = state.current_state;
			state.current_state =
			    AddOperator::Operation<timestamp_t, interval_t, timestamp_t>(state.current_state, state.increment);
		}
		if (size == 0) {
			// move to next row
			state.current_input_row++;
			state.initialized_row = false;
			continue;
		}
		output.SetCardinality(size);
		return OperatorResultType::HAVE_MORE_OUTPUT;
	}
}